

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O3

void __thiscall
protozero::basic_pbf_writer<protozero::fixed_size_buffer_adaptor>::close_submessage
          (basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *this)

{
  assert_error *this_00;
  
  if (this->m_data == (fixed_size_buffer_adaptor *)0x0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"m_data");
    __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->m_pos != 0) && (this->m_rollback_pos != 0xffffffffffffffff)) {
    if (this->m_data->m_size == this->m_pos) {
      rollback_submessage(this);
      return;
    }
    commit_submessage(this);
    return;
  }
  return;
}

Assistant:

void close_submessage() {
        protozero_assert(m_data);
        if (m_pos == 0 || m_rollback_pos == size_is_known) {
            return;
        }
        if (buffer_customization<TBuffer>::size(m_data) - m_pos == 0) {
            rollback_submessage();
        } else {
            commit_submessage();
        }
    }